

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void OpenSteer::drawCircleOrDisk
               (float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d
               )

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Vec3 *pVVar11;
  PFNGLCOLOR3FPROC p_Var12;
  Vec3 *pVVar13;
  Color *extraout_RDX;
  Color *pCVar14;
  Color *extraout_RDX_00;
  undefined3 in_register_00000081;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  int iVar17;
  GLenum GVar18;
  int iVar19;
  float fVar20;
  GLfloat extraout_XMM0_Da;
  float fVar21;
  float extraout_XMM0_Da_00;
  GLfloat GVar22;
  float extraout_XMM0_Db;
  GLfloat GVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float __x;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vec3 VVar31;
  float fVar32;
  float local_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  Vec3 *local_b0;
  undefined1 local_a8 [16];
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace> local_90;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar17 = CONCAT31(in_register_00000089,in3d);
  uVar15 = CONCAT31(in_register_00000081,filled);
  local_90.super_AbstractLocalSpace._vptr_AbstractLocalSpace =
       (_func_int **)&PTR__AbstractLocalSpace_001775c0;
  local_90._forward.x = 0.0;
  local_90._forward.y = 0.0;
  local_90._side.x = -1.0;
  local_90._side.z = 0.0;
  local_90._side.y = 0.0;
  local_90._up.x = 0.0;
  local_90._up.y = 1.0;
  local_90._up.z = 0.0;
  local_90._forward.z = 1.0;
  local_90._position.x = 0.0;
  local_90._position.y = 0.0;
  local_90._position.z = 0.0;
  pCVar14 = color;
  uVar16 = uVar15;
  iVar19 = segments;
  local_b0 = center;
  if (iVar17 != 0) {
    local_c4 = axis->z * axis->z + axis->x * axis->x + axis->y * axis->y;
    if (local_c4 < 0.0) {
      local_c4 = sqrtf(local_c4);
    }
    else {
      local_c4 = SQRT(local_c4);
    }
    if (local_c4 <= 0.0) {
      uVar2 = axis->x;
      uVar7 = axis->y;
      local_a8._4_4_ = uVar7;
      local_a8._0_4_ = uVar2;
      local_a8._8_8_ = 0;
      local_c4 = axis->z;
    }
    else {
      uVar1 = axis->x;
      uVar6 = axis->y;
      auVar27._4_4_ = uVar6;
      auVar27._0_4_ = uVar1;
      auVar27._8_8_ = 0;
      auVar30._4_4_ = local_c4;
      auVar30._0_4_ = local_c4;
      auVar30._8_4_ = local_c4;
      auVar30._12_4_ = local_c4;
      local_a8 = divps(auVar27,auVar30);
      local_c4 = axis->z / local_c4;
    }
    uVar26 = 0;
    uVar25 = 0;
    uVar24 = 0;
    VVar31 = findPerpendicularIn3d(axis);
    fVar21 = VVar31.z;
    auVar29._0_8_ = VVar31._0_8_;
    auVar29._8_4_ = extraout_XMM0_Dc;
    auVar29._12_4_ = extraout_XMM0_Dd;
    fVar20 = fVar21 * fVar21 + VVar31.x * VVar31.x + VVar31.y * VVar31.y;
    if (fVar20 < 0.0) {
      local_58 = auVar29;
      local_48 = fVar21;
      uStack_44 = uVar24;
      uStack_40 = uVar25;
      uStack_3c = uVar26;
      fVar20 = sqrtf(fVar20);
      fVar21 = local_48;
      auVar29 = local_58;
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    local_90._forward._0_8_ = auVar29._0_8_;
    if (0.0 < fVar20) {
      auVar28._4_4_ = fVar20;
      auVar28._0_4_ = fVar20;
      auVar28._8_4_ = fVar20;
      auVar28._12_4_ = fVar20;
      auVar30 = divps(auVar29,auVar28);
      local_90._forward._0_8_ = auVar30._0_8_;
    }
    local_90._forward.z =
         (float)(~-(uint)(0.0 < fVar20) & (uint)fVar21 |
                (uint)(fVar21 / fVar20) & -(uint)(0.0 < fVar20));
    local_90._up.x = local_a8._0_4_;
    local_90._up.y = local_a8._4_4_;
    local_90._up.z = local_c4;
    uVar3 = local_b0->x;
    uVar8 = local_b0->y;
    local_90._position.z = local_b0->z;
    local_90._position.x = (float)uVar3;
    local_90._position.y = (float)uVar8;
    LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setUnitSideFromForwardAndUp(&local_90);
    pCVar14 = extraout_RDX;
  }
  GVar18 = 2;
  if (filled) {
    (*glad_glPushAttrib)(0x2000);
    (*glad_glDisable)(0xb44);
    GVar18 = 6;
    pCVar14 = extraout_RDX_00;
  }
  p_Var12 = glad_glColor3f;
  fStack_bc = 0.0;
  fStack_b8 = 0.0;
  local_c0 = radius;
  Color::r(color,center,pCVar14,iVar19,(char *)CONCAT44(in_register_00000084,uVar16),iVar17,
           (int)radius);
  GVar22 = extraout_XMM0_Da;
  fVar21 = Color::g(color);
  local_a8._0_4_ = fVar21;
  fVar21 = Color::b(color);
  (*p_Var12)(GVar22,(GLfloat)local_a8._0_4_,fVar21);
  (*glad_glBegin)(GVar18);
  if (filled) {
    pVVar13 = &local_90._position;
    if (!in3d) {
      pVVar13 = local_b0;
    }
    uVar4 = pVVar13->x;
    uVar9 = pVVar13->y;
    pVVar13 = local_b0;
    if (in3d) {
      pVVar13 = &local_90._position;
    }
    (*glad_glVertex3f)((GLfloat)uVar4,(GLfloat)uVar9,pVVar13->z);
  }
  pVVar13 = local_b0;
  local_58._0_4_ = uVar15;
  iVar19 = (uint)filled + segments;
  if (iVar19 != 0 && SCARRY4((uint)filled,segments) == iVar19 < 0) {
    __x = 6.2831855 / (float)segments;
    fVar20 = 0.0;
    fVar32 = 0.0;
    fVar21 = __x;
    do {
      local_a8._0_4_ = fVar20;
      if (in3d) {
        (*local_90.super_AbstractLocalSpace._vptr_AbstractLocalSpace[0xf])(&local_90,&local_c0);
        GVar22 = local_90._position.x + extraout_XMM0_Da_00;
        GVar23 = local_90._position.y + extraout_XMM0_Db;
        pVVar11 = &local_90._position;
      }
      else {
        uVar5 = local_b0->x;
        uVar10 = local_b0->y;
        GVar22 = (float)uVar5 + local_c0;
        GVar23 = (float)uVar10 + fStack_bc;
        fVar21 = fStack_b8;
        pVVar11 = pVVar13;
      }
      (*glad_glVertex3f)(GVar22,GVar23,fVar21 + pVVar11->z);
      fVar20 = (float)local_a8._0_4_;
      if ((((fVar32 == 0.0) && (!NAN(fVar32))) && ((float)local_a8._0_4_ == 0.0)) &&
         (!NAN((float)local_a8._0_4_))) {
        fVar32 = sinf(__x);
        fVar20 = cosf(__x);
      }
      fVar21 = fVar32 * local_c0;
      local_c0 = local_c0 * fVar20 + fVar32 * fStack_b8;
      fVar21 = fStack_b8 * fVar20 - fVar21;
      iVar19 = iVar19 + -1;
      fStack_b8 = fVar21;
    } while (iVar19 != 0);
  }
  (*glad_glEnd)();
  if (local_58[0] != '\0') {
    (*glad_glPopAttrib)();
  }
  return;
}

Assistant:

void 
OpenSteer::drawCircleOrDisk (const float radius,
                             const Vec3& axis,
                             const Vec3& center,
                             const Color& color,
                             const int segments,
                             const bool filled,
                             const bool in3d)
{
    LocalSpace ls;
    if (in3d)
    {
        // define a local space with "axis" as the Y/up direction
        // (XXX should this be a method on  LocalSpace?)
        const Vec3 unitAxis = axis.normalize ();
        const Vec3 unitPerp = findPerpendicularIn3d (axis).normalize ();
        ls.setUp (unitAxis);
        ls.setForward (unitPerp);
        ls.setPosition (center);
        ls.setUnitSideFromForwardAndUp ();
    }
        
    // make disks visible (not culled) from both sides 
    if (filled) beginDoubleSidedDrawing ();

    // point to be rotated about the (local) Y axis, angular step size
    Vec3 pointOnCircle (radius, 0, 0);
    const float step = (2 * OPENSTEER_M_PI) / segments;

    // set drawing color
    glColor3f (color.r(), color.g(), color.b());

    // begin drawing a triangle fan (for disk) or line loop (for circle)
    glBegin (filled ? GL_TRIANGLE_FAN : GL_LINE_LOOP);

    // for the filled case, first emit the center point
    if (filled) iglVertexVec3 (in3d ? ls.position() : center);

    // rotate p around the circle in "segments" steps
    float sin=0, cos=0;
    const int vertexCount = filled ? segments+1 : segments;
    for (int i = 0; i < vertexCount; i++)
    {
        // emit next point on circle, either in 3d (globalized out
        // of the local space), or in 2d (offset from the center)
        iglVertexVec3 (in3d ?
                           ls.globalizePosition (pointOnCircle) :
                           (Vec3) (pointOnCircle + center));

        // rotate point one more step around circle
        pointOnCircle = pointOnCircle.rotateAboutGlobalY (step, sin, cos);
    }

    // close drawing operation
    glEnd ();
    if (filled) endDoubleSidedDrawing ();
}